

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * signrawtransactionwithkey(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffd558;
  allocator<RPCArg> *paVar2;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffd560;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffd568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd590;
  allocator<char> *in_stack_ffffffffffffd598;
  UniValue *in_stack_ffffffffffffd5a0;
  undefined7 in_stack_ffffffffffffd5a8;
  undefined1 in_stack_ffffffffffffd5af;
  string *in_stack_ffffffffffffd5b0;
  undefined7 in_stack_ffffffffffffd5b8;
  undefined1 in_stack_ffffffffffffd5bf;
  undefined4 in_stack_ffffffffffffd5c0;
  Type in_stack_ffffffffffffd5c4;
  string *in_stack_ffffffffffffd5c8;
  undefined4 in_stack_ffffffffffffd5d0;
  Type in_stack_ffffffffffffd5d4;
  undefined4 in_stack_ffffffffffffd5d8;
  Type in_stack_ffffffffffffd5dc;
  RPCArg *in_stack_ffffffffffffd5e0;
  RPCArgOptions *in_stack_ffffffffffffd600;
  RPCExamples *in_stack_ffffffffffffd6a0;
  RPCResults *in_stack_ffffffffffffd6a8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffd6b0;
  undefined1 *puVar3;
  string *in_stack_ffffffffffffd6b8;
  string *in_stack_ffffffffffffd6c0;
  RPCHelpMan *in_stack_ffffffffffffd6c8;
  undefined1 *local_2930;
  undefined1 *local_2918;
  undefined1 *local_2900;
  undefined1 *local_28e8;
  undefined1 *local_28d0;
  undefined1 *local_28b8;
  undefined1 *local_28a0;
  RPCMethodImpl *fun;
  undefined1 local_24e0 [34];
  allocator<char> local_24be;
  allocator<char> local_24bd;
  allocator<char> local_24bc [4];
  pointer local_24b8;
  pointer pRStack_24b0;
  pointer local_24a8;
  allocator<char> local_249a;
  undefined1 local_2499 [32];
  allocator<char> local_2479 [30];
  allocator<char> local_245b;
  allocator<char> local_245a [18];
  undefined8 local_2448;
  allocator<char> local_243a;
  allocator<char> local_2439 [31];
  allocator<char> local_241a;
  allocator<char> local_2419;
  _Alloc_hider local_2418;
  size_type sStack_2410;
  undefined1 local_2408 [15];
  allocator<char> local_23f9;
  pointer local_23f8;
  pointer pbStack_23f0;
  pointer local_23e8;
  allocator<char> local_23da;
  allocator<char> local_23d9 [31];
  allocator<char> local_23ba;
  allocator<char> local_23b9 [31];
  allocator<char> local_239a;
  allocator<char> local_2399;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  allocator<char> local_237a;
  allocator<char> local_2379;
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  allocator<char> local_235a;
  allocator<char> local_2359 [31];
  allocator<char> local_233a;
  allocator<char> local_2339 [28];
  allocator<char> local_231d;
  allocator<char> local_231c [3];
  allocator<char> local_2319;
  undefined4 local_2318;
  allocator<char> local_2312;
  allocator<char> local_2311;
  undefined4 local_2310;
  allocator<char> local_230a;
  allocator<char> local_2309;
  undefined4 local_2308;
  allocator<char> local_2302;
  allocator<char> local_2301;
  undefined4 local_2300;
  allocator<char> local_22fa;
  allocator<char> local_22f9;
  undefined4 local_22f8;
  allocator<char> local_22f2;
  allocator<char> local_22f1;
  undefined4 local_22f0;
  allocator<char> local_22e9 [32];
  allocator<char> local_22c9;
  undefined4 local_22c8;
  allocator<char> local_22c1 [32];
  allocator<char> local_22a1;
  undefined4 local_22a0;
  allocator<char> local_229b [2];
  allocator<char> local_2299;
  undefined4 local_2298;
  allocator<char> local_2291 [32];
  allocator<char> local_2271;
  undefined4 local_2270;
  allocator<char> local_226a;
  allocator<char> local_2269;
  undefined4 local_2268;
  allocator<char> local_2261 [31];
  allocator<char> local_2242;
  allocator<char> local_2241 [513];
  undefined1 local_2040 [64];
  undefined8 local_2000;
  undefined1 local_1fb8 [192];
  undefined1 local_1ef8 [816];
  undefined1 local_1bc8 [64];
  undefined1 local_1b88 [136];
  undefined1 local_1b00 [192];
  undefined1 local_1a40 [408];
  undefined1 local_18a8 [200];
  undefined1 local_17e0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined1 local_17a0;
  undefined1 local_179f;
  allocator<RPCArg> local_16a0 [40];
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined1 local_1660;
  undefined1 local_165f;
  allocator<RPCArg> local_1658 [40];
  undefined8 local_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined1 local_1618;
  undefined1 local_1617;
  undefined1 local_1610;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined1 local_15d0;
  undefined1 local_15cf;
  undefined1 local_1528;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined1 local_14e8;
  undefined1 local_14e7;
  undefined1 local_1440;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined1 local_1400;
  undefined1 local_13ff;
  undefined1 local_1358;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined1 local_1318;
  undefined1 local_1317;
  undefined1 local_1270;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined1 local_1230;
  undefined1 local_122f;
  undefined1 local_1188;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined1 local_1148;
  undefined1 local_1147;
  undefined1 local_10a0 [160];
  undefined8 local_1000;
  undefined1 local_a70 [160];
  undefined1 local_9d0 [264];
  undefined1 local_8c8 [160];
  allocator<RPCArg> local_828 [40];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8;
  undefined1 local_7e7;
  undefined1 local_7e0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined1 local_7a0;
  undefined1 local_79f;
  undefined1 local_6f8 [264];
  undefined1 local_5f0 [160];
  undefined1 local_550;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined1 local_510;
  undefined1 local_50f;
  undefined1 local_468 [1056];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2268 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_550 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_528 = 0;
  uStack_520 = 0;
  local_518 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd558);
  local_510 = 0;
  local_50f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2270 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2298 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_7e0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_7b8 = 0;
  uStack_7b0 = 0;
  local_7a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd558);
  local_7a0 = 0;
  local_79f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffd558);
  __l._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd598,__l,
             (allocator_type *)in_stack_ffffffffffffd590);
  local_828[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_800 = 0;
  uStack_7f8 = 0;
  local_7f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd558);
  local_7e8 = 0;
  local_7e7 = 0;
  paVar2 = local_828;
  RPCArg::RPCArg(in_stack_ffffffffffffd5e0,
                 (string *)CONCAT44(in_stack_ffffffffffffd5dc,in_stack_ffffffffffffd5d8),
                 in_stack_ffffffffffffd5d4,(Fallback *)in_stack_ffffffffffffd5c8,
                 (string *)CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_22a0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_22c8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_22f0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_1188 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1160 = 0;
  uStack_1158 = 0;
  local_1150 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1148 = 0;
  local_1147 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_22f8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_1270 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1248 = 0;
  uStack_1240 = 0;
  local_1238 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1230 = 0;
  local_122f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2300 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_1358 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1330 = 0;
  uStack_1328 = 0;
  local_1320 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1318 = 0;
  local_1317 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2308 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_1440 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1418 = 0;
  uStack_1410 = 0;
  local_1408 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1400 = 0;
  local_13ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2310 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_1528 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1500 = 0;
  uStack_14f8 = 0;
  local_14f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_14e8 = 0;
  local_14e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2318 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,&in_stack_ffffffffffffd560->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_1610 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_15e8 = 0;
  uStack_15e0 = 0;
  local_15d8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_15d0 = 0;
  local_15cf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd598,__l_00,
             (allocator_type *)in_stack_ffffffffffffd590);
  local_1658[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1630 = 0;
  uStack_1628 = 0;
  local_1620 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1618 = 0;
  local_1617 = 0;
  paVar2 = local_1658;
  RPCArg::RPCArg(in_stack_ffffffffffffd5e0,
                 (string *)CONCAT44(in_stack_ffffffffffffd5dc,in_stack_ffffffffffffd5d8),
                 in_stack_ffffffffffffd5d4,(Fallback *)in_stack_ffffffffffffd5c8,
                 (string *)CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd600);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd598,__l_01,
             (allocator_type *)in_stack_ffffffffffffd590);
  local_16a0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_1678 = 0;
  uStack_1670 = 0;
  local_1668 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1660 = 0;
  local_165f = 0;
  paVar2 = local_16a0;
  RPCArg::RPCArg(in_stack_ffffffffffffd5e0,
                 (string *)CONCAT44(in_stack_ffffffffffffd5dc,in_stack_ffffffffffffd5d8),
                 in_stack_ffffffffffffd5d4,(Fallback *)in_stack_ffffffffffffd5c8,
                 (string *)CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  UniValue::UniValue<const_char_(&)[35],_char[35],_true>
            (in_stack_ffffffffffffd5a0,(char (*) [35])in_stack_ffffffffffffd598);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_17e0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd570);
  local_17b8 = 0;
  uStack_17b0 = 0;
  local_17a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_17a0 = 0;
  local_179f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
                 in_stack_ffffffffffffd5c8,in_stack_ffffffffffffd5c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
                 in_stack_ffffffffffffd5b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd598,__l_02,
             (allocator_type *)in_stack_ffffffffffffd590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2378 = 0;
  uStack_2370 = 0;
  local_2368 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2398 = 0;
  uStack_2390 = 0;
  local_2388 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_23f8 = (pointer)0x0;
  pbStack_23f0 = (pointer)0x0;
  local_23e8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2418._M_p = (pointer)0x0;
  sStack_2410 = 0;
  local_2408._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_245a[2] = (allocator<char>)0x0;
  local_245a[3] = (allocator<char>)0x0;
  local_245a[4] = (allocator<char>)0x0;
  local_245a[5] = (allocator<char>)0x0;
  local_245a[6] = (allocator<char>)0x0;
  local_245a[7] = (allocator<char>)0x0;
  local_245a[8] = (allocator<char>)0x0;
  local_245a[9] = (allocator<char>)0x0;
  local_245a[10] = (allocator<char>)0x0;
  local_245a[0xb] = (allocator<char>)0x0;
  local_245a[0xc] = (allocator<char>)0x0;
  local_245a[0xd] = (allocator<char>)0x0;
  local_245a[0xe] = (allocator<char>)0x0;
  local_245a[0xf] = (allocator<char>)0x0;
  local_245a[0x10] = (allocator<char>)0x0;
  local_245a[0x11] = (allocator<char>)0x0;
  local_2448._0_1_ = '\0';
  local_2448._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd598,__l_03,
             (allocator_type *)in_stack_ffffffffffffd590);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2479[1] = (allocator<char>)0x0;
  local_2479[2] = (allocator<char>)0x0;
  local_2479[3] = (allocator<char>)0x0;
  local_2479[4] = (allocator<char>)0x0;
  local_2479[5] = (allocator<char>)0x0;
  local_2479[6] = (allocator<char>)0x0;
  local_2479[7] = (allocator<char>)0x0;
  local_2479[8] = (allocator<char>)0x0;
  local_2479[9] = (allocator<char>)0x0;
  local_2479[10] = (allocator<char>)0x0;
  local_2479[0xb] = (allocator<char>)0x0;
  local_2479[0xc] = (allocator<char>)0x0;
  local_2479[0xd] = (allocator<char>)0x0;
  local_2479[0xe] = (allocator<char>)0x0;
  local_2479[0xf] = (allocator<char>)0x0;
  local_2479[0x10] = (allocator<char>)0x0;
  local_2479[0x11] = (allocator<char>)0x0;
  local_2479[0x12] = (allocator<char>)0x0;
  local_2479[0x13] = (allocator<char>)0x0;
  local_2479[0x14] = (allocator<char>)0x0;
  local_2479[0x15] = (allocator<char>)0x0;
  local_2479[0x16] = (allocator<char>)0x0;
  local_2479[0x17] = (allocator<char>)0x0;
  local_2479[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_2499._1_8_ = 0;
  local_2499._9_8_ = 0;
  local_2499._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  fun = (RPCMethodImpl *)local_2499;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  local_24b8 = (pointer)0x0;
  pRStack_24b0 = (pointer)0x0;
  local_24a8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd598,__l_04,
             (allocator_type *)in_stack_ffffffffffffd590);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd598,__l_05,
             (allocator_type *)in_stack_ffffffffffffd590);
  this = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffd5dc,in_stack_ffffffffffffd5d8),
             in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5c8,
             SUB41(in_stack_ffffffffffffd5c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffd5bf,in_stack_ffffffffffffd5b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd5b0,
             (bool)in_stack_ffffffffffffd5af);
  std::allocator<RPCResult>::allocator(this);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffd5a8;
  __l_06._M_array = (iterator)in_stack_ffffffffffffd5a0;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffd5af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd598,__l_06,
             (allocator_type *)in_stack_ffffffffffffd590);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd5e0,in_stack_ffffffffffffd5dc,
             (string *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0),
             in_stack_ffffffffffffd5c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd5c4,in_stack_ffffffffffffd5c0),
             (bool)in_stack_ffffffffffffd5bf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffd5dc,in_stack_ffffffffffffd5d8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffd5d4,in_stack_ffffffffffffd5d0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  HelpExampleCli(in_stack_ffffffffffffd590,in_stack_ffffffffffffd588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd5af,in_stack_ffffffffffffd5a8),
             (char *)in_stack_ffffffffffffd5a0,in_stack_ffffffffffffd598);
  HelpExampleRpc(in_stack_ffffffffffffd590,in_stack_ffffffffffffd588);
  std::operator+(in_stack_ffffffffffffd590,in_stack_ffffffffffffd588);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x6a0c5e);
  this_00 = (RPCArg *)local_24e0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<signrawtransactionwithkey()::__0,void>
            (in_stack_ffffffffffffd568,(anon_class_1_0_00000001 *)in_stack_ffffffffffffd560);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffd6c8,in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8,
             in_stack_ffffffffffffd6b0,in_stack_ffffffffffffd6a8,in_stack_ffffffffffffd6a0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_24e0 + 0x21));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_24be);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_24bd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_24bc);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_28a0 = local_18a8;
  do {
    local_28a0 = local_28a0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_28a0 != local_1a40);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_28b8 = local_1b00;
  do {
    local_28b8 = local_28b8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_28b8 != local_1b88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_28d0 = local_1bc8;
  do {
    local_28d0 = local_28d0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_28d0 != local_1ef8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_249a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_2499);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2499 + 0x1f));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2479);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_245b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_245a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_28e8 = local_1fb8;
  do {
    local_28e8 = local_28e8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_28e8 != local_2040);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_243a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2439);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_241a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2419);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2408 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_23f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_23da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_23d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_23ba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_23b9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_239a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2399);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_237a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2379);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd568);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_235a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2359);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_233a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2339);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_2900 = local_48;
  do {
    local_2900 = local_2900 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_2900 != local_468);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_231d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_231c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_2918 = local_8c8;
  do {
    local_2918 = local_2918 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_2918 != local_9d0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_10a0;
  local_2930 = local_a70;
  do {
    local_2930 = local_2930 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_2930 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2319);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2312);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2311);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_230a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2309);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2302);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2301);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_22fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_22f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_22f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_22f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_22e9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_22c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_22c1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_22a1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_229b);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd568);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_6f8;
  puVar1 = local_5f0;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2299);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2291);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2271);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_226a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2269);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2261);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2242);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2241);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan signrawtransactionwithkey()
{
    return RPCHelpMan{"signrawtransactionwithkey",
                "\nSign inputs for raw transaction (serialized, hex-encoded).\n"
                "The second argument is an array of base58-encoded private\n"
                "keys that will be the only keys used to sign the transaction.\n"
                "The third optional argument (may be null) is an array of previous transaction outputs that\n"
                "this transaction depends on but may not yet be in the block chain.\n",
                {
                    {"hexstring", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction hex string"},
                    {"privkeys", RPCArg::Type::ARR, RPCArg::Optional::NO, "The base58-encoded private keys for signing",
                        {
                            {"privatekey", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "private key in base58-encoding"},
                        },
                        },
                    {"prevtxs", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "The previous dependent transaction outputs",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                    {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                                    {"scriptPubKey", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "output script"},
                                    {"redeemScript", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "(required for P2SH) redeem script"},
                                    {"witnessScript", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "(required for P2WSH or P2SH-P2WSH) witness script"},
                                    {"amount", RPCArg::Type::AMOUNT, RPCArg::Optional::OMITTED, "(required for Segwit inputs) the amount spent"},
                                },
                                },
                        },
                        },
                    {"sighashtype", RPCArg::Type::STR, RPCArg::Default{"DEFAULT for Taproot, ALL otherwise"}, "The signature hash type. Must be one of:\n"
            "       \"DEFAULT\"\n"
            "       \"ALL\"\n"
            "       \"NONE\"\n"
            "       \"SINGLE\"\n"
            "       \"ALL|ANYONECANPAY\"\n"
            "       \"NONE|ANYONECANPAY\"\n"
            "       \"SINGLE|ANYONECANPAY\"\n"
                    },
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "hex", "The hex-encoded raw transaction with signature(s)"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                        {RPCResult::Type::ARR, "errors", /*optional=*/true, "Script verification errors (if there are any)",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR_HEX, "txid", "The hash of the referenced, previous transaction"},
                                {RPCResult::Type::NUM, "vout", "The index of the output to spent and used as input"},
                                {RPCResult::Type::ARR, "witness", "",
                                {
                                    {RPCResult::Type::STR_HEX, "witness", ""},
                                }},
                                {RPCResult::Type::STR_HEX, "scriptSig", "The hex-encoded signature script"},
                                {RPCResult::Type::NUM, "sequence", "Script sequence number"},
                                {RPCResult::Type::STR, "error", "Verification or signing error related to the input"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("signrawtransactionwithkey", "\"myhex\" \"[\\\"key1\\\",\\\"key2\\\"]\"")
            + HelpExampleRpc("signrawtransactionwithkey", "\"myhex\", \"[\\\"key1\\\",\\\"key2\\\"]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    CMutableTransaction mtx;
    if (!DecodeHexTx(mtx, request.params[0].get_str())) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed. Make sure the tx has at least one input.");
    }

    FlatSigningProvider keystore;
    const UniValue& keys = request.params[1].get_array();
    for (unsigned int idx = 0; idx < keys.size(); ++idx) {
        UniValue k = keys[idx];
        CKey key = DecodeSecret(k.get_str());
        if (!key.IsValid()) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key");
        }

        CPubKey pubkey = key.GetPubKey();
        CKeyID key_id = pubkey.GetID();
        keystore.pubkeys.emplace(key_id, pubkey);
        keystore.keys.emplace(key_id, key);
    }

    // Fetch previous transactions (inputs):
    std::map<COutPoint, Coin> coins;
    for (const CTxIn& txin : mtx.vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    NodeContext& node = EnsureAnyNodeContext(request.context);
    FindCoins(node, coins);

    // Parse the prevtxs array
    ParsePrevouts(request.params[2], &keystore, coins);

    UniValue result(UniValue::VOBJ);
    SignTransaction(mtx, &keystore, coins, request.params[3], result);
    return result;
},
    };
}